

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall ProString::operator==(ProString *this,char *other)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLatin1String QStack_38;
  QStringView local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_data = (this->m_string).d.ptr;
  local_28.m_size = (this->m_string).d.size;
  local_28 = QStringView::mid(&local_28,(long)this->m_offset,(long)this->m_length);
  QLatin1String::QLatin1String(&QStack_38,other);
  bVar1 = comparesEqual(&QStack_38,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const char *other) const { return toQStringView() == QLatin1String(other); }